

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

void __thiscall
CNetAddr::Serialize<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
          (CNetAddr *this,ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *s)

{
  long lVar1;
  SerParams *pSVar2;
  CNetAddr *in_RSI;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *in_stack_ffffffffffffffd8;
  CNetAddr *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pSVar2 = ParamsStream<VectorWriter_&,_CNetAddr::SerParams>::GetParams<CNetAddr::SerParams>
                     (in_stack_ffffffffffffffd8);
  if (pSVar2->enc == V2) {
    SerializeV2Stream<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
              (this_00,(ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RSI);
  }
  else {
    SerializeV1Stream<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
              (in_RSI,(ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        if (s.template GetParams<SerParams>().enc == Encoding::V2) {
            SerializeV2Stream(s);
        } else {
            SerializeV1Stream(s);
        }
    }